

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall Catch::Session::useConfigData(Session *this,ConfigData *configData)

{
  ConfigData *in_RSI;
  Config *in_RDI;
  unique_ptr<Catch::Config> *unaff_retaddr;
  
  ConfigData::operator=(in_RSI,(ConfigData *)in_RDI);
  Detail::unique_ptr<Catch::Config>::reset(unaff_retaddr,in_RDI);
  return;
}

Assistant:

void Session::useConfigData( ConfigData const& configData ) {
        m_configData = configData;
        m_config.reset();
    }